

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char>_>
fmt::v8::detail::copy_str<char,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char>_> out)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (; begin != end; begin = begin + 1) {
    uStack_28 = CONCAT17(*begin,(undefined7)uStack_28);
    buffer<char>::push_back(out.container,(char *)((long)&uStack_28 + 7));
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}